

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::ImageLoadStoreMultipleUniformsTest::prepareShaderForTestedShaderStage
          (ImageLoadStoreMultipleUniformsTest *this,shaderStage stage,string *out_code)

{
  TestError *this_00;
  ostream *poVar1;
  string local_220 [36];
  imageStoreCall local_1fc;
  imageStoreCall local_1f4;
  imageLoadCall local_1ec;
  coordinatesVariableDeclaration local_1e8;
  coordinatesVariableDeclaration local_1e0;
  GLuint local_1d8;
  imageUniformDeclaration local_1d4;
  GLint i_1;
  GLint i;
  undefined4 local_1bc;
  stringstream local_1b8 [8];
  stringstream stream;
  ostream local_1a8;
  char *local_30;
  char *stage_specific_layout;
  string *psStack_20;
  GLint max_image_uniforms;
  string *out_code_local;
  ImageLoadStoreMultipleUniformsTest *pIStack_10;
  shaderStage stage_local;
  ImageLoadStoreMultipleUniformsTest *this_local;
  
  psStack_20 = out_code;
  out_code_local._4_4_ = stage;
  pIStack_10 = this;
  stage_specific_layout._4_4_ = getMaximumImageUniformsForStage(this,stage);
  local_30 = "";
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (stage_specific_layout._4_4_ < 2) {
    local_1bc = 1;
  }
  else {
    switch(out_code_local._4_4_) {
    case fragmentShaderStage:
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid shader stage",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderImageLoadStoreTests.cpp"
                 ,0x245e);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    case geometryShaderStage:
      local_30 = "layout(points) in;\nlayout(points, max_vertices = 1) out;\n\n";
      break;
    case tesselationControlShaderStage:
      local_30 = "layout(vertices = 4) out;\n\n";
      break;
    case tesselationEvalutaionShaderStage:
      local_30 = "layout(quads, equal_spacing, ccw) in;\n\n";
      break;
    case vertexShaderStage:
    }
    poVar1 = std::operator<<(&local_1a8,
                             "#version 400 core\n#extension GL_ARB_shader_image_load_store : require\n\nprecision highp float;\n\n"
                            );
    std::operator<<(poVar1,local_30);
    for (i_1 = 0; i_1 < stage_specific_layout._4_4_; i_1 = i_1 + 1) {
      imageUniformDeclaration::imageUniformDeclaration(&local_1d4,i_1);
      poVar1 = anon_unknown_0::operator<<(&local_1a8,&local_1d4);
      std::operator<<(poVar1,"\n");
    }
    std::operator<<(&local_1a8,"\nvoid main()\n{\n");
    for (local_1d8 = 0; (int)local_1d8 < stage_specific_layout._4_4_; local_1d8 = local_1d8 + 1) {
      poVar1 = std::operator<<(&local_1a8,"    ");
      coordinatesVariableDeclaration::coordinatesVariableDeclaration(&local_1e0,local_1d8,0);
      poVar1 = anon_unknown_0::operator<<(poVar1,&local_1e0);
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"    ");
      coordinatesVariableDeclaration::coordinatesVariableDeclaration(&local_1e8,local_1d8,1);
      poVar1 = anon_unknown_0::operator<<(poVar1,&local_1e8);
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"    ");
      imageLoadCall::imageLoadCall(&local_1ec,local_1d8);
      poVar1 = anon_unknown_0::operator<<(poVar1,&local_1ec);
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"    ");
      imageStoreCall::imageStoreCall(&local_1f4,local_1d8,0);
      poVar1 = anon_unknown_0::operator<<(poVar1,&local_1f4);
      poVar1 = std::operator<<(poVar1,"\n");
      poVar1 = std::operator<<(poVar1,"    ");
      imageStoreCall::imageStoreCall(&local_1fc,local_1d8,1);
      poVar1 = anon_unknown_0::operator<<(poVar1,&local_1fc);
      std::operator<<(poVar1,"\n");
      if ((int)(local_1d8 + 1) < stage_specific_layout._4_4_) {
        std::operator<<(&local_1a8,"\n");
      }
    }
    std::operator<<(&local_1a8,"}\n\n");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)psStack_20,local_220);
    std::__cxx11::string::~string(local_220);
    local_1bc = 0;
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return;
}

Assistant:

void prepareShaderForTestedShaderStage(shaderStage stage, std::string& out_code)
	{
		GLint			  max_image_uniforms	= getMaximumImageUniformsForStage(stage);
		const char*		  stage_specific_layout = "";
		std::stringstream stream;

		if (m_min_required_image_uniforms > max_image_uniforms)
		{
			return;
		}

		/* Expected result follows
		 *
		 * #version 400 core
		 * #extension GL_ARB_shader_image_load_store : require
		 *
		 * precision highp float;
		 *
		 * stage_specific_layout goes here
		 *
		 * Uniform declarations go here
		 *
		 * void main()
		 * {
		 *     const ivec2 row_0_coordinates(0, 0);
		 *     const ivec2 row_1_coordinates(0, 1);
		 *
		 *     For each index <0, GL_MAX_*_IMAGE_UNIFORMS>
		 *
		 *     vec4 loaded_value_0 = imageLoad(u_image_0, row_0_coordinates);
		 *
		 *     imageStore(u_image_0, row_0_coordinates, -loaded_value_0);
		 *     imageStore(u_image_0, row_1_coordinates, loaded_value_0);
		 * }
		 */

		/* Get piece of code specific for stage */
		switch (stage)
		{
		case fragmentShaderStage:
			break;

		case geometryShaderStage:
			stage_specific_layout = "layout(points) in;\n"
									"layout(points, max_vertices = 1) out;\n"
									"\n";
			break;

		case tesselationControlShaderStage:
			stage_specific_layout = "layout(vertices = 4) out;\n"
									"\n";
			break;

		case tesselationEvalutaionShaderStage:
			stage_specific_layout = "layout(quads, equal_spacing, ccw) in;\n"
									"\n";
			break;

		case vertexShaderStage:
			break;

		default:
			TCU_FAIL("Invalid shader stage");
		}

		/* Preamble */
		stream << "#version 400 core\n"
				  "#extension GL_ARB_shader_image_load_store : require\n"
				  "\n"
				  "precision highp float;\n"
				  "\n"
			   << stage_specific_layout;

		/* Image uniforms declarations */
		for (GLint i = 0; i < max_image_uniforms; ++i)
		{
			stream << imageUniformDeclaration(i) << "\n";
		}

		/* Main opening */
		stream << "\n"
				  "void main()\n"
				  "{\n";

		/* imageLoad and imageStores for each uniform */
		for (GLint i = 0; i < max_image_uniforms; ++i)
		{
			stream << "    " << coordinatesVariableDeclaration(i, 0) << "\n"
				   << "    " << coordinatesVariableDeclaration(i, 1) << "\n"
				   << "\n"
				   << "    " << imageLoadCall(i) << "\n"
				   << "\n"
				   << "    " << imageStoreCall(i, 0) << "\n"
				   << "    " << imageStoreCall(i, 1) << "\n";

			if (max_image_uniforms > i + 1)
			{
				stream << "\n";
			}
		}

		/* Main closing */
		stream << "}\n\n";

		/* Done */
		out_code = stream.str();
	}